

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_elements_input_init
              (uchar *txhash,size_t txhash_len,uint32_t utxo_index,uint32_t sequence,uchar *script,
              size_t script_len,wally_tx_witness_stack *witness,uchar *nonce,size_t nonce_len,
              uchar *entropy,size_t entropy_len,uchar *issuance_amount,size_t issuance_amount_len,
              uchar *inflation_keys,size_t inflation_keys_len,uchar *issuance_amount_rangeproof,
              size_t issuance_amount_rangeproof_len,uchar *inflation_keys_rangeproof,
              size_t inflation_keys_rangeproof_len,wally_tx_witness_stack *pegin_witness,
              wally_tx_input *output,_Bool is_elements)

{
  uint8_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  undefined1 free_parent;
  wally_tx_witness_stack **ppwVar8;
  bool bVar9;
  uchar *local_48;
  wally_tx_witness_stack *new_pegin_witness;
  wally_tx_witness_stack *new_witness;
  
  new_witness = (wally_tx_witness_stack *)0x0;
  new_pegin_witness = (wally_tx_witness_stack *)0x0;
  if (txhash_len != 0x20 || txhash == (uchar *)0x0) {
    return -2;
  }
  free_parent = (script_len == 0) == (script != (uchar *)0x0);
  if (output == (wally_tx_input *)0x0 || (bool)free_parent) {
    return -2;
  }
  uVar1 = output->features;
  if (witness == (wally_tx_witness_stack *)0x0) {
    iVar6 = 0;
  }
  else {
    ppwVar8 = &new_witness;
    iVar6 = wally_tx_witness_stack_clone_alloc(witness,ppwVar8);
    free_parent = SUB81(ppwVar8,0);
  }
  if (pegin_witness != (wally_tx_witness_stack *)0x0 && iVar6 == 0) {
    ppwVar8 = &new_pegin_witness;
    iVar6 = wally_tx_witness_stack_clone_alloc(pegin_witness,ppwVar8);
    free_parent = SUB81(ppwVar8,0);
  }
  if (iVar6 == 0) {
    if (script_len == 0) {
      local_48 = (uchar *)0x0;
    }
    else {
      local_48 = (uchar *)wally_malloc(script_len);
      if (local_48 == (uchar *)0x0) {
        iVar6 = -3;
        goto LAB_00176d25;
      }
      memcpy(local_48,script,script_len);
    }
    output->features = '\0';
    iVar6 = tx_elements_input_issuance_init
                      (output,nonce,nonce_len,entropy,entropy_len,issuance_amount,
                       issuance_amount_len,inflation_keys,inflation_keys_len,
                       issuance_amount_rangeproof,issuance_amount_rangeproof_len,
                       inflation_keys_rangeproof,inflation_keys_rangeproof_len,is_elements);
    free_parent = SUB81(nonce,0);
    if (iVar6 == 0) {
      if (utxo_index == 0xffffffff) {
        if (*txhash == '\0') {
          uVar5 = 0;
          do {
            uVar7 = uVar5;
            if (uVar7 == 0x1f) break;
            uVar5 = uVar7 + 1;
          } while (txhash[uVar7 + 1] == '\0');
          bVar9 = 0x1e < uVar7;
        }
        else {
          bVar9 = false;
        }
      }
      else {
        bVar9 = false;
      }
      uVar2 = *(undefined8 *)txhash;
      uVar3 = *(undefined8 *)(txhash + 8);
      uVar4 = *(undefined8 *)(txhash + 0x18);
      *(undefined8 *)(output->txhash + 0x10) = *(undefined8 *)(txhash + 0x10);
      *(undefined8 *)(output->txhash + 0x18) = uVar4;
      *(undefined8 *)output->txhash = uVar2;
      *(undefined8 *)(output->txhash + 8) = uVar3;
      if ((bool)(!is_elements | bVar9)) {
        output->index = utxo_index;
      }
      else {
        output->index = utxo_index & 0x3fffffff;
        if ((utxo_index >> 0x1e & 1) != 0) {
          output->features = output->features | 4;
        }
      }
      if (bVar9) {
        output->features = output->features | 8;
      }
      output->sequence = sequence;
      output->script = local_48;
      output->script_len = script_len;
      output->witness = new_witness;
      output->pegin_witness = new_pegin_witness;
      return 0;
    }
  }
  else {
LAB_00176d25:
    local_48 = (uchar *)0x0;
  }
  tx_witness_stack_free(new_witness,(_Bool)free_parent);
  tx_witness_stack_free(new_pegin_witness,(_Bool)free_parent);
  clear_and_free(local_48,script_len);
  output->features = uVar1;
  return iVar6;
}

Assistant:

static int tx_elements_input_init(
    const unsigned char *txhash, size_t txhash_len,
    uint32_t utxo_index, uint32_t sequence,
    const unsigned char *script, size_t script_len,
    const struct wally_tx_witness_stack *witness,
    const unsigned char *nonce, size_t nonce_len,
    const unsigned char *entropy, size_t entropy_len,
    const unsigned char *issuance_amount, size_t issuance_amount_len,
    const unsigned char *inflation_keys, size_t inflation_keys_len,
    const unsigned char *issuance_amount_rangeproof, size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof, size_t inflation_keys_rangeproof_len,
    const struct wally_tx_witness_stack *pegin_witness,
    struct wally_tx_input *output, bool is_elements)
{
    struct wally_tx_witness_stack *new_witness = NULL;
    struct wally_tx_witness_stack *new_pegin_witness = NULL;
    unsigned char *new_script = NULL;
    int ret = WALLY_OK, old_features;

    if (!txhash || txhash_len != WALLY_TXHASH_LEN ||
        BYTES_INVALID(script, script_len) || !output)
        return WALLY_EINVAL;

    old_features = output->features;

    if (witness)
        ret = wally_tx_witness_stack_clone_alloc(witness, &new_witness);
    if (ret == WALLY_OK && pegin_witness)
        ret = wally_tx_witness_stack_clone_alloc(pegin_witness, &new_pegin_witness);
    if (ret == WALLY_OK && !clone_bytes(&new_script, script, script_len))
        ret = WALLY_ENOMEM;
    if (ret == WALLY_OK) {
        output->features = 0;
        ret = tx_elements_input_issuance_init(output,
                                              nonce,
                                              nonce_len,
                                              entropy,
                                              entropy_len,
                                              issuance_amount,
                                              issuance_amount_len,
                                              inflation_keys,
                                              inflation_keys_len,
                                              issuance_amount_rangeproof,
                                              issuance_amount_rangeproof_len,
                                              inflation_keys_rangeproof,
                                              inflation_keys_rangeproof_len,
                                              is_elements);
    }

    if (ret != WALLY_OK) {
        wally_tx_witness_stack_free(new_witness);
        wally_tx_witness_stack_free(new_pegin_witness);
        clear_and_free(new_script, script_len);
        output->features = old_features;
    } else {
        const bool is_coinbase = is_coinbase_bytes(txhash, WALLY_TXHASH_LEN, utxo_index);
        memcpy(output->txhash, txhash, WALLY_TXHASH_LEN);
        if (is_elements && !is_coinbase)
            output->index = utxo_index & WALLY_TX_INDEX_MASK;
        else
            output->index = utxo_index;
        if (is_elements && !is_coinbase && (utxo_index & WALLY_TX_PEGIN_FLAG))
            output->features |= WALLY_TX_IS_PEGIN;
        if (is_coinbase)
            output->features |= WALLY_TX_IS_COINBASE;
        output->sequence = sequence;
        output->script = new_script;
        output->script_len = script_len;
        output->witness = new_witness;
#ifdef BUILD_ELEMENTS
        output->pegin_witness = new_pegin_witness;
#endif /* BUILD_ELEMENTS */
    }
    return ret;
}